

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)> *
anon_unknown.dwarf_85be2f::ArchToolsetHelper
          (function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)>
           *__return_storage_ptr__,offset_in_ConfigurePreset_to_string valueField,
          offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
          strategyField)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  offset_in_ConfigurePreset_to_string *poVar2;
  code *local_100 [2];
  code *local_f0;
  code *local_e8;
  string_view local_e0;
  string_view local_d0;
  undefined1 local_c0 [88];
  Object<cmCMakePresetsGraph::ConfigurePreset> objectHelper;
  
  local_100[1] = (code *)0x0;
  local_100[0] = JsonErrors::INVALID_OBJECT;
  local_e8 = std::
             _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
             ::_M_manager;
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_c0,
             (ObjectErrorGenerator *)local_100,false);
  local_d0._M_len = 5;
  local_d0._M_str = "value";
  pOVar1 = cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>
                     ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_c0,&local_d0,valueField,
                      cmCMakePresetsGraphInternal::PresetStringHelper,false);
  local_e0._M_len = 8;
  local_e0._M_str = "strategy";
  pOVar1 = cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>,bool(*)(std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>&,Json::Value_const*,cmJSONState*)>
                     (pOVar1,&local_e0,strategyField,ArchToolsetStrategyHelper,false);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object(&objectHelper,pOVar1);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_c0);
  std::_Function_base::~_Function_base((_Function_base *)local_100);
  pOVar1 = (Object<cmCMakePresetsGraph::ConfigurePreset> *)(local_c0 + 0x10);
  local_c0._0_8_ = valueField;
  local_c0._8_8_ = strategyField;
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object(pOVar1,&objectHelper);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  poVar2 = (offset_in_ConfigurePreset_to_string *)operator_new(0x58);
  *poVar2 = local_c0._0_8_;
  poVar2[1] = local_c0._8_8_;
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)(poVar2 + 2),pOVar1);
  *(offset_in_ConfigurePreset_to_string **)
   &(__return_storage_ptr__->super__Function_base)._M_functor = poVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:69:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:69:10)>
       ::_M_manager;
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(pOVar1);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&objectHelper);
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(ConfigurePreset&, const Json::Value*, cmJSONState*)>
ArchToolsetHelper(
  std::string ConfigurePreset::*valueField,
  cm::optional<ArchToolsetStrategy> ConfigurePreset::*strategyField)
{
  auto const objectHelper =
    JSONHelperBuilder::Object<ConfigurePreset>(JsonErrors::INVALID_OBJECT,
                                               false)
      .Bind("value", valueField,
            cmCMakePresetsGraphInternal::PresetStringHelper, false)
      .Bind("strategy", strategyField, ArchToolsetStrategyHelper, false);
  return [valueField, strategyField,
          objectHelper](ConfigurePreset& out, const Json::Value* value,
                        cmJSONState* state) -> bool {
    if (!value) {
      (out.*valueField).clear();
      out.*strategyField = cm::nullopt;
      return true;
    }

    if (value->isString()) {
      out.*valueField = value->asString();
      out.*strategyField = cm::nullopt;
      return true;
    }

    if (value->isObject()) {
      return objectHelper(out, value, state);
    }

    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  };
}